

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardingTimeCoordinator.hpp
# Opt level: O2

void __thiscall
helics::ForwardingTimeCoordinator::ForwardingTimeCoordinator(ForwardingTimeCoordinator *this)

{
  BaseTimeCoordinator::BaseTimeCoordinator(&this->super_BaseTimeCoordinator);
  (this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator =
       (_func_int **)&PTR__BaseTimeCoordinator_004c9620;
  DependencyInfo::DependencyInfo(&this->upstream);
  DependencyInfo::DependencyInfo(&this->downstream);
  this->iterating = false;
  this->ignoreMinFed = false;
  this->sequenceModifier = 0;
  return;
}

Assistant:

ForwardingTimeCoordinator() = default;